

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::
WriteValue<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>>
          (Serializer *this,
          unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *map)

{
  __node_base *p_Var1;
  
  (*this->_vptr_Serializer[8])();
  p_Var1 = &(map->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    (*this->_vptr_Serializer[6])(this);
    WriteProperty<unsigned_long>(this,0,"key",(unsigned_long *)(p_Var1 + 1));
    WriteProperty<unsigned_long>(this,1,"value",(unsigned_long *)(p_Var1 + 2));
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const duckdb::unordered_map<K, V, HASH, CMP> &map) {
		auto count = map.size();
		OnListBegin(count);
		for (auto &item : map) {
			OnObjectBegin();
			WriteProperty(0, "key", item.first);
			WriteProperty(1, "value", item.second);
			OnObjectEnd();
		}
		OnListEnd();
	}